

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_multiple.h
# Opt level: O0

bool __thiscall
density::detail::
LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
::Consume::move_next(Consume *this)

{
  bool bVar1;
  uintptr_t uVar2;
  ControlBlock *i_second;
  uintptr_t potentially_different_next_ptr;
  ControlBlock *next;
  Consume *this_local;
  
  bVar1 = empty(this);
  if (bVar1) {
    density_tests::detail::assert_failed<unsigned_long&>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_multiple.h"
               ,0xd2,&this->m_next_ptr);
  }
  i_second = (ControlBlock *)(this->m_next_ptr & 0xfffffffffffffff0);
  bVar1 = LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
          ::same_page(this->m_control,i_second);
  if (!bVar1) {
    basic_default_allocator<65536UL>::pin_page
              ((basic_default_allocator<65536UL> *)this->m_queue,i_second);
    uVar2 = raw_atomic_load(&this->m_control->m_next,memory_order_seq_cst);
    basic_default_allocator<65536UL>::unpin_page
              ((basic_default_allocator<65536UL> *)this->m_queue,this->m_control);
    if (uVar2 == 0) {
      this->m_control = i_second;
      begin_iteration(this,this->m_queue);
      return true;
    }
  }
  this->m_control = i_second;
  uVar2 = raw_atomic_load(&this->m_control->m_next,memory_order_seq_cst);
  this->m_next_ptr = uVar2;
  bVar1 = empty(this);
  if ((!bVar1) && (this->m_next_ptr < 0x10000)) {
    density_tests::detail::assert_failed<>
              ("empty() || m_next_ptr >= ALLOCATOR_TYPE::page_alignment",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_multiple.h"
               ,0xed);
  }
  return true;
}

Assistant:

bool move_next() noexcept
                {
                    DENSITY_ASSERT_INTERNAL(!empty(), m_next_ptr);

                    DENSITY_ASSUME_ALIGNED(m_control, Base::s_alloc_granularity);

                    auto next = reinterpret_cast<ControlBlock *>(m_next_ptr & ~LfQueue_AllFlags);
                    if (!Base::same_page(m_control, next))
                    {
                        DENSITY_ASSUME(next != nullptr);
                        m_queue->ALLOCATOR_TYPE::pin_page(next);

                        auto const potentially_different_next_ptr =
                          raw_atomic_load(&m_control->m_next, mem_relaxed);

                        m_queue->ALLOCATOR_TYPE::unpin_page(m_control);

                        if (potentially_different_next_ptr == 0)
                        {
                            /* the control block has been zeroed in the meanwhile, we have to restart */
                            m_control = next;
                            begin_iteration(m_queue);
                            return true;
                        }
                    }

                    m_control  = next;
                    m_next_ptr = raw_atomic_load(&m_control->m_next, mem_relaxed);
                    DENSITY_ASSERT_INTERNAL(
                      empty() || m_next_ptr >= ALLOCATOR_TYPE::page_alignment);
                    return true;
                }